

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)27>::~BlockExprBase(BlockExprBase<(wabt::ExprType)27> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expr *pEVar2;
  pointer pTVar3;
  pointer pcVar4;
  _func_int ***ppp_Var5;
  
  (this->super_ExprMixin<(wabt::ExprType)27>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BlockExprBase_001a4df0;
  pEVar2 = (this->block).exprs.first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var5 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var5)[1])();
  }
  (this->block).exprs.first_ = (Expr *)0x0;
  (this->block).exprs.last_ = (Expr *)0x0;
  (this->block).exprs.size_ = 0;
  pTVar3 = (this->block).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)(this->block).decl.sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar3);
  }
  pTVar3 = (this->block).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)(this->block).decl.sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar3);
  }
  Var::~Var(&(this->block).decl.type_var);
  pcVar4 = (this->block).label._M_dataplus._M_p;
  paVar1 = &(this->block).label.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x118);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}